

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestSchema::readRawData(TestSchema *this)

{
  streambuf *psVar1;
  ostream *this_00;
  ostream *in_RDI;
  Parser<avro::ReaderImpl<avro::NullValidator>_> p;
  ostream os;
  ifstream in;
  InputBuffer *in_stack_fffffffffffffbf8;
  OutputBuffer *in_stack_fffffffffffffc18;
  InputBuffer *in_stack_fffffffffffffc20;
  undefined1 local_370 [352];
  undefined1 local_210 [104];
  Parser<avro::ReaderImpl<avro::NullValidator>_> *in_stack_fffffffffffffe58;
  TestSchema *in_stack_fffffffffffffe60;
  
  std::ifstream::ifstream(local_210,"test.avro",_S_in);
  avro::ostream::ostream(in_RDI);
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_370,psVar1);
  this_00 = (ostream *)avro::ostream::getBuffer((ostream *)0x29b6e9);
  avro::InputBuffer::InputBuffer(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::Parser
            ((Parser<avro::ReaderImpl<avro::NullValidator>_> *)this_00,in_stack_fffffffffffffbf8);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x29b71c);
  readData<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::~Parser
            ((Parser<avro::ReaderImpl<avro::NullValidator>_> *)0x29b737);
  avro::ostream::~ostream(this_00);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void readRawData() {
        std::ifstream in("test.avro");
        ostream os;
        os << in.rdbuf();
        Parser<Reader> p(os.getBuffer());
        readData(p);
    }